

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

int nni_msgq_resize(nni_msgq *mq,int cap)

{
  uint uVar1;
  nni_msg *pnVar2;
  nni_msg **ptr;
  uint uVar3;
  uint uVar4;
  uint local_40;
  uint oldalloc;
  uint oldlen;
  uint oldget;
  nni_msg **oldq;
  nni_msg **newq;
  nni_msg *msg;
  uint alloc;
  int cap_local;
  nni_msgq *mq_local;
  
  uVar3 = cap + 2;
  if (mq->mq_alloc < uVar3) {
    oldq = (nni_msg **)nni_zalloc((ulong)uVar3 << 3);
    if (oldq == (nni_msg **)0x0) {
      return 2;
    }
  }
  else {
    oldq = (nni_msg **)0x0;
  }
  nni_mtx_lock(&mq->mq_lock);
  while (cap + 1U < mq->mq_len) {
    uVar1 = mq->mq_get;
    mq->mq_get = uVar1 + 1;
    pnVar2 = mq->mq_msgs[uVar1];
    if (mq->mq_alloc < mq->mq_get) {
      mq->mq_get = 0;
    }
    mq->mq_len = mq->mq_len - 1;
    nni_msg_free(pnVar2);
  }
  if (oldq == (nni_msg **)0x0) {
    mq->mq_cap = cap;
  }
  else {
    ptr = mq->mq_msgs;
    oldalloc = mq->mq_get;
    uVar1 = mq->mq_alloc;
    local_40 = mq->mq_len;
    mq->mq_msgs = oldq;
    mq->mq_put = 0;
    mq->mq_get = 0;
    mq->mq_len = 0;
    mq->mq_cap = cap;
    mq->mq_alloc = uVar3;
    for (; local_40 != 0; local_40 = local_40 - 1) {
      uVar4 = oldalloc + 1;
      pnVar2 = ptr[oldalloc];
      uVar3 = mq->mq_put;
      mq->mq_put = uVar3 + 1;
      mq->mq_msgs[uVar3] = pnVar2;
      oldalloc = uVar4;
      if (uVar4 == uVar1) {
        oldalloc = 0;
      }
      if (mq->mq_put == mq->mq_alloc) {
        mq->mq_put = 0;
      }
      mq->mq_len = mq->mq_len + 1;
    }
    nni_free(ptr,(ulong)uVar1 << 3);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return 0;
}

Assistant:

int
nni_msgq_resize(nni_msgq *mq, int cap)
{
	unsigned  alloc;
	nni_msg  *msg;
	nni_msg **newq, **oldq;
	unsigned  oldget;
	unsigned  oldlen;
	unsigned  oldalloc;

	alloc = cap + 2;

	if (alloc > mq->mq_alloc) {
		newq = nni_zalloc(sizeof(nni_msg *) * alloc);
		if (newq == NULL) {
			return (NNG_ENOMEM);
		}
	} else {
		newq = NULL;
	}

	nni_mtx_lock(&mq->mq_lock);
	while (mq->mq_len > ((unsigned) cap + 1)) {
		// too many messages -- we allow that one for
		// the case of pushback or cap == 0.
		// we delete the oldest messages first
		msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get > mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}
	if (newq == NULL) {
		// Just shrinking the queue, no changes
		mq->mq_cap = cap;
		goto out;
	}

	oldq     = mq->mq_msgs;
	oldget   = mq->mq_get;
	oldalloc = mq->mq_alloc;
	oldlen   = mq->mq_len;

	mq->mq_msgs = newq;
	mq->mq_len = mq->mq_get = mq->mq_put = 0;
	mq->mq_cap                           = cap;
	mq->mq_alloc                         = alloc;

	while (oldlen) {
		mq->mq_msgs[mq->mq_put++] = oldq[oldget++];
		if (oldget == oldalloc) {
			oldget = 0;
		}
		if (mq->mq_put == mq->mq_alloc) {
			mq->mq_put = 0;
		}
		mq->mq_len++;
		oldlen--;
	}
	nni_free(oldq, sizeof(nni_msg *) * oldalloc);

out:
	// Wake everyone up -- we changed everything.
	nni_mtx_unlock(&mq->mq_lock);
	return (0);
}